

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QMimeGlobPattern>::end(QList<QMimeGlobPattern> *this)

{
  QMimeGlobPattern *n;
  QArrayDataPointer<QMimeGlobPattern> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QMimeGlobPattern> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QMimeGlobPattern> *)0x8f05f9);
  QArrayDataPointer<QMimeGlobPattern>::operator->(in_RDI);
  n = QArrayDataPointer<QMimeGlobPattern>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }